

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedQueue.h
# Opt level: O2

Buffer * __thiscall
SynchronizedQueue<Buffer>::get(Buffer *__return_storage_ptr__,SynchronizedQueue<Buffer> *this)

{
  size_type sVar1;
  
  (__return_storage_ptr__->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Semaphore::p((Semaphore *)this);
  sVar1 = std::deque<Buffer,_std::allocator<Buffer>_>::size(&(this->values).c);
  if (sVar1 == 0) {
    Monitor::wait(&this->super_Monitor,&this->isEmpty);
  }
  std::vector<char,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->data,
             &((this->values).c.super__Deque_base<Buffer,_std::allocator<Buffer>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur)->data);
  std::deque<Buffer,_std::allocator<Buffer>_>::pop_front(&(this->values).c);
  Semaphore::v((Semaphore *)this);
  return __return_storage_ptr__;
}

Assistant:

T SynchronizedQueue<T>::get() {
    T value;
    enter();
    if (values.size() == 0)
        Monitor::wait(isEmpty);
    value = values.front();
    values.pop();
    leave();
    return value;
}